

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O2

void __thiscall
MinVR::VRDataQueue::addSerializedQueue(VRDataQueue *this,serialData *serializedQueue)

{
  longlong timeStamp_00;
  long lVar1;
  VRError *this_00;
  int iVar2;
  allocator<char> local_24c;
  allocator<char> local_24b;
  allocator<char> local_24a;
  allocator<char> local_249;
  int local_248;
  int numIncluded;
  VRDataQueue *local_240;
  longlong timeStamp;
  string local_230;
  string local_210;
  string local_1f0;
  serialData local_1d0;
  string local_1b0 [12];
  
  if (0x11 < serializedQueue->_M_string_length) {
    local_240 = this;
    std::__cxx11::string::find((char *)serializedQueue,0x143203);
    std::__cxx11::string::substr((ulong)&local_230,(ulong)serializedQueue);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_230,_S_in);
    std::istream::operator>>((istream *)local_1b0,&numIncluded);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::find((char *)serializedQueue,0x1405ed);
    iVar2 = 0;
    while( true ) {
      lVar1 = std::__cxx11::string::find((char *)serializedQueue,0x14418e);
      if (lVar1 == -1) break;
      std::__cxx11::string::find((char *)serializedQueue,0x1441ab);
      std::__cxx11::string::substr((ulong)&local_230,(ulong)serializedQueue);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1b0,(string *)&local_230,_S_in);
      std::istream::_M_extract<long_long>((longlong *)local_1b0);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::find((char *)serializedQueue,0x1441ae);
      timeStamp_00 = timeStamp;
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)serializedQueue);
      push(local_240,timeStamp_00,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      iVar2 = iVar2 + 1;
    }
    if (numIncluded != iVar2) {
      this_00 = (VRError *)__cxa_allocate_exception(0xa8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"Serialized queue appears corrupted.",&local_249);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"",&local_24a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataQueue.cpp"
                 ,&local_24b);
      local_248 = 0x3b;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,
                 "void MinVR::VRDataQueue::addSerializedQueue(const VRDataQueue::serialData)",
                 &local_24c);
      VRError::VRError(this_00,local_1b0,&local_230,&local_1f0,&local_248,&local_210);
      __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
    }
  }
  return;
}

Assistant:

void VRDataQueue::addSerializedQueue(const VRDataQueue::serialData serializedQueue) {

  // Looking for the number in <VRDataQueue num="X">
  if (serializedQueue.size() < 18) return;

  std::size_t start, end;

  start = 18;
  end = serializedQueue.find("\"", start);

  //std::cout << serializedQueue.substr(start, end - start) << std::endl;

  int numIncluded;
  std::istringstream( serializedQueue.substr(start,end)) >> numIncluded;
  start = serializedQueue.find(">", end);

  // Found the number of items.  Now parse the items, making sure to
  // record the timeStamp of each one.

  int numReceived = 0;
  long long timeStamp;
  start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", start);
  while (start != std::string::npos) {

    end = serializedQueue.find("\">", start);
    // These constants have to do with the length of the tags used to
    // encode a queue.
    std::istringstream(serializedQueue.substr(start + 28, end - start - 28)) >>
      timeStamp;

    start = serializedQueue.find("</VRDataQueueItem>", end);
    push(timeStamp, serializedQueue.substr(end + 2, start - end - 2) );
    numReceived++;
    start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", end);
  }

  if (numReceived != numIncluded) {
    VRERRORNOADV("Serialized queue appears corrupted.");
  }
}